

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

int ktx::validateMemory(char *data,size_t size,bool warningsAsErrors,bool GLTFBasisU,
                       function<void_(const_ktx::ValidationReport_&)> *callback)

{
  _Manager_type p_Var1;
  int iVar2;
  _Any_data local_168;
  _Manager_type local_158;
  _Invoker_type local_150;
  ValidationContextMemory ctx;
  
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_158 = (_Manager_type)0x0;
  local_150 = callback->_M_invoker;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_168._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_168._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_158 = p_Var1;
  }
  ValidationContextMemory::ValidationContextMemory
            (&ctx,warningsAsErrors,GLTFBasisU,
             (function<void_(const_ktx::ValidationReport_&)> *)&local_168,data,size);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  iVar2 = ValidationContext::validate(&ctx.super_ValidationContext,true);
  ValidationContext::~ValidationContext(&ctx.super_ValidationContext);
  return iVar2;
}

Assistant:

int validateMemory(const char* data, std::size_t size, bool warningsAsErrors, bool GLTFBasisU, std::function<void(const ValidationReport&)> callback) {
    try {
        ValidationContextMemory ctx{warningsAsErrors, GLTFBasisU, std::move(callback), data, size};
        return ctx.validate();
    } catch (const FatalValidationError&) {
        return +rc::INVALID_FILE;
    }
}